

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  ulong uVar1;
  byte bVar2;
  undefined1 *puVar3;
  bool donated;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  LogMessage *pLVar6;
  Message *pMVar7;
  Arena *pAVar8;
  FieldDescriptor *field_00;
  string *this_00;
  string temp;
  LogFinisher local_169;
  Reflection *local_168;
  ConstStringParam local_160;
  FieldDescriptor *local_158;
  Arena *local_150;
  Message *local_148;
  uint32_t local_13c;
  ulong local_138;
  undefined1 *local_130;
  size_t local_128;
  undefined1 local_120 [16];
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar1 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  local_150 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    local_150 = *(Arena **)local_150;
  }
  uVar1 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    pAVar8 = *(Arena **)pAVar8;
  }
  this = &r->schema_;
  local_168 = r;
  local_148 = rhs;
  uVar4 = ReflectionSchema::GetFieldOffset(this,field);
  local_160 = (ConstStringParam)CONCAT44(local_160._4_4_,uVar4);
  uVar4 = ReflectionSchema::GetFieldOffset(this,field);
  local_158 = field;
  uVar5 = ReflectionSchema::InlinedStringIndex(this,field);
  local_138 = CONCAT44(extraout_var,uVar5);
  if ((r->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar6 = LogMessage::operator<<(&local_a0,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=((LogFinisher *)&local_110,pLVar6);
    LogMessage::~LogMessage(&local_a0);
  }
  local_13c = ReflectionSchema::InlinedStringDonatedOffset(this);
  if ((local_168->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar6 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=((LogFinisher *)&local_110,pLVar6);
    LogMessage::~LogMessage(&local_68);
  }
  pMVar7 = local_148;
  this_00 = (string *)
            ((long)&(lhs->super_MessageLite)._vptr_MessageLite + ((ulong)local_160 & 0xffffffff));
  local_160 = (ConstStringParam)
              ((long)&(local_148->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  ReflectionSchema::InlinedStringDonatedOffset(this);
  bVar2 = (byte)local_138 & 0x1f;
  if (local_150 == pAVar8) {
    field_00 = local_158;
    if ((local_168->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar6 = LogMessage::operator<<(&local_d8,"CHECK failed: schema_.HasInlinedString(): ");
      field_00 = local_158;
      LogFinisher::operator=((LogFinisher *)&local_110,pLVar6);
      LogMessage::~LogMessage(&local_d8);
      pMVar7 = local_148;
    }
    uVar4 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar5 = ReflectionSchema::InlinedStringIndex(this,field_00);
    anon_unknown_0::IsIndexInHasBitSet
              ((uint32_t *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),uVar5)
    ;
    if ((local_168->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar6 = LogMessage::operator<<(&local_110,"CHECK failed: schema_.HasInlinedString(): ");
      LogFinisher::operator=((LogFinisher *)&local_130,pLVar6);
      pMVar7 = local_148;
      LogMessage::~LogMessage(&local_110);
    }
    uVar4 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar5 = ReflectionSchema::InlinedStringIndex(this,field_00);
    anon_unknown_0::IsIndexInHasBitSet
              ((uint32_t *)((long)&(pMVar7->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
               uVar5);
    std::__cxx11::string::swap(this_00);
  }
  else {
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,*(long *)this_00,*(long *)(this_00 + 8) + *(long *)this_00);
    if ((local_168->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar6 = LogMessage::operator<<(&local_d8,"CHECK failed: schema_.HasInlinedString(): ");
      LogFinisher::operator=((LogFinisher *)&local_110,pLVar6);
      LogMessage::~LogMessage(&local_d8);
    }
    uVar4 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar5 = ReflectionSchema::InlinedStringIndex(this,local_158);
    donated = anon_unknown_0::IsIndexInHasBitSet
                        ((uint32_t *)
                         ((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),uVar5);
    InlinedStringField::Set
              ((InlinedStringField *)this_00,(string *)0x0,local_160,local_150,donated,
               (uint32_t *)
               ((long)&(lhs->super_MessageLite)._vptr_MessageLite +
               (local_138 >> 5 & 0x7ffffff) * 4 + (ulong)local_13c),
               -2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    if ((local_168->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar6 = LogMessage::operator<<(&local_110,"CHECK failed: schema_.HasInlinedString(): ");
      LogFinisher::operator=(&local_169,pLVar6);
      LogMessage::~LogMessage(&local_110);
    }
    uVar4 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar5 = ReflectionSchema::InlinedStringIndex(this,local_158);
    anon_unknown_0::IsIndexInHasBitSet
              ((uint32_t *)((long)&(local_148->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
               uVar5);
    puVar3 = local_130;
    if ((long)local_128 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_128,"string length exceeds max size");
    }
    std::__cxx11::string::_M_replace
              ((ulong)local_160,0,(char *)local_160->_M_string_length,(ulong)puVar3);
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}